

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

char * __thiscall
CoreML::Specification::CeilLayerParams::_InternalParse
          (CeilLayerParams *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *pbVar5;
  uint res;
  InternalMetadata *this_00;
  pair<const_char_*,_unsigned_int> pVar6;
  byte *local_28;
  
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  local_28 = (byte *)ptr;
  do {
    bVar3 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_28,ctx->group_depth_);
    if (bVar3) {
      return (char *)local_28;
    }
    bVar1 = *local_28;
    res = (uint)bVar1;
    pbVar5 = local_28 + 1;
    if ((char)bVar1 < '\0') {
      res = ((uint)bVar1 + (uint)*pbVar5 * 0x80) - 0x80;
      if ((char)*pbVar5 < '\0') {
        pVar6 = google::protobuf::internal::ReadTagFallback((char *)local_28,res);
        pbVar5 = (byte *)pVar6.first;
        res = pVar6.second;
      }
      else {
        pbVar5 = local_28 + 2;
      }
    }
    local_28 = pbVar5;
    if (res == 0 || (res & 7) == 4) {
      if (pbVar5 == (byte *)0x0) {
        iVar4 = 4;
      }
      else {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
        iVar4 = 5;
      }
    }
    else {
      uVar2 = this_00->ptr_;
      if ((uVar2 & 1) == 0) {
        unknown = google::protobuf::internal::InternalMetadata::
                  mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
      }
      else {
        unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((uVar2 & 0xfffffffffffffffc) + 8);
      }
      local_28 = (byte *)google::protobuf::internal::UnknownFieldParse
                                   (res,unknown,(char *)local_28,ctx);
      iVar4 = (uint)(local_28 == (byte *)0x0) << 2;
    }
  } while (iVar4 == 0);
  if (iVar4 == 4) {
    local_28 = (byte *)0x0;
  }
  return (char *)local_28;
}

Assistant:

const char* CeilLayerParams::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}